

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleSizeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  char cVar2;
  bool bVar3;
  unsigned_long __val;
  ostream *poVar4;
  unsigned_long uVar5;
  char cVar6;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    cVar6 = '\x01';
    bVar3 = cmsys::SystemTools::FileExists(pbVar1 + 1,true);
    if (bVar3) {
      this_00 = (this->super_cmCommand).Makefile;
      __val = cmsys::SystemTools::FileLength(pbVar1 + 1);
      if (9 < __val) {
        uVar5 = __val;
        cVar2 = '\x04';
        do {
          cVar6 = cVar2;
          if (uVar5 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_0023b609;
          }
          if (uVar5 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_0023b609;
          }
          if (uVar5 < 10000) goto LAB_0023b609;
          bVar3 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar2 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_0023b609:
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct((ulong)local_1a8,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_1a8._0_8_,local_1a8._8_4_,__val);
      cmMakefile::AddDefinition(this_00,pbVar1 + 2,(char *)local_1a8._0_8_);
      if ((_func_int **)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
      }
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"SIZE requested of path that is not readable:\n  ",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pbVar1[1]._M_dataplus._M_p,pbVar1[1]._M_string_length);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1c8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," requires a file name and output variable",0x29);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool cmFileCommand::HandleSizeCommand(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    std::ostringstream e;
    e << args[0] << " requires a file name and output variable";
    this->SetError(e.str());
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& filename = args[argsIndex++];

  const std::string& outputVariable = args[argsIndex++];

  if (!cmSystemTools::FileExists(filename, true)) {
    std::ostringstream e;
    e << "SIZE requested of path that is not readable:\n  " << filename;
    this->SetError(e.str());
    return false;
  }

  this->Makefile->AddDefinition(
    outputVariable,
    std::to_string(cmSystemTools::FileLength(filename)).c_str());

  return true;
}